

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_head.c
# Opt level: O3

void test_ext(fitsfile *infits,FILE *out,FitsHdu *hduptr)

{
  int iVar1;
  FitsKey **ppFVar2;
  FitsKey *pFVar3;
  double dVar4;
  char **ppcVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  size_t __nmemb;
  void *pvVar9;
  long lVar10;
  ushort **ppuVar11;
  uint uVar12;
  void *pvVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  int iVar18;
  
  iVar1 = hduptr->tkeys;
  __nmemb = (size_t)iVar1;
  ppFVar2 = hduptr->kwds;
  uVar16 = hduptr->hdunum;
  if (1 < (int)uVar16) {
    uVar15 = uVar16 + 1;
    do {
      iVar6 = test_hduname(uVar16,uVar15 - 2);
      if (iVar6 != 0) {
        sprintf(comm,"The HDU %d and %d have identical type/name/version",(ulong)uVar16,
                (ulong)(uVar15 - 2));
        wrtwrn(out,comm,0);
      }
      uVar15 = uVar15 - 1;
    } while (2 < uVar15);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"PCOUNT",7);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstre);
  if (pvVar9 == (void *)0x0) {
LAB_0010fc10:
    builtin_strncpy(errmes + 0x10,"PCOUNT keyword.",0x10);
    builtin_strncpy(errmes,"cannot find the ",0x10);
    wrterr(out,errmes,1);
  }
  else {
    uVar14 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    uVar16 = (uint)uVar14;
    if ((int)uVar16 < 2) {
      uVar15 = uVar16;
      uVar12 = 1;
    }
    else {
      uVar12 = 1;
      uVar14 = uVar14 & 0xffffffff;
      pvVar13 = pvVar9;
      do {
        uVar15 = (uint)uVar14;
        pvVar13 = (void *)((long)pvVar13 + -8);
        iVar6 = compstre(&ptemp,pvVar13);
        if (iVar6 != 0) goto LAB_0010fb3c;
        uVar14 = (ulong)(uVar15 - 1);
        uVar12 = uVar12 + 1;
      } while (uVar15 - 1 != 1);
      uVar15 = 1;
      uVar12 = uVar16;
    }
LAB_0010fb3c:
    if ((int)(uVar15 + uVar12) < iVar1) {
      iVar6 = uVar15 + uVar12;
      do {
        iVar6 = iVar6 + 1;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstre(&ptemp,pvVar9);
        if (iVar7 != 0) break;
      } while (iVar6 < iVar1);
    }
    if ((int)uVar15 < 0) goto LAB_0010fc10;
    pFVar3 = hduptr->kwds[uVar15];
    iVar6 = check_int(pFVar3,out);
    if (iVar6 != 0) {
      dVar4 = atof(pFVar3->kvalue);
      hduptr->pcount = (long)dVar4;
    }
    iVar6 = pFVar3->kindex;
    if (iVar6 != hduptr->naxis + 4) {
      sprintf(errmes,"PCOUNT is not in record %d of the header.");
      wrterr(out,errmes,1);
      iVar6 = pFVar3->kindex;
    }
    check_fixed_int(cards[(long)iVar6 + -1],out);
  }
  ppcVar5 = tmpkwds;
  builtin_strncpy(temp,"GCOUNT",7);
  ptemp = temp;
  pvVar9 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstre);
  if (pvVar9 != (void *)0x0) {
    uVar14 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
    uVar16 = (uint)uVar14;
    if ((int)uVar16 < 2) {
      uVar15 = uVar16;
      uVar12 = 1;
    }
    else {
      uVar12 = 1;
      uVar14 = uVar14 & 0xffffffff;
      pvVar13 = pvVar9;
      do {
        uVar15 = (uint)uVar14;
        pvVar13 = (void *)((long)pvVar13 + -8);
        iVar6 = compstre(&ptemp,pvVar13);
        if (iVar6 != 0) goto LAB_0010fcf3;
        uVar14 = (ulong)(uVar15 - 1);
        uVar12 = uVar12 + 1;
      } while (uVar15 - 1 != 1);
      uVar15 = 1;
      uVar12 = uVar16;
    }
LAB_0010fcf3:
    if ((int)(uVar15 + uVar12) < iVar1) {
      iVar6 = uVar15 + uVar12;
      do {
        iVar6 = iVar6 + 1;
        pvVar9 = (void *)((long)pvVar9 + 8);
        iVar7 = compstre(&ptemp,pvVar9);
        if (iVar7 != 0) break;
      } while (iVar6 < iVar1);
    }
    if (-1 < (int)uVar15) {
      pFVar3 = hduptr->kwds[uVar15];
      iVar6 = check_int(pFVar3,out);
      if (iVar6 != 0) {
        lVar10 = strtol(pFVar3->kvalue,(char **)0x0,10);
        hduptr->gcount = (int)lVar10;
      }
      iVar6 = pFVar3->kindex;
      if (iVar6 != hduptr->naxis + 5) {
        sprintf(errmes,"GCOUNT is not in record %d of the header.");
        wrterr(out,errmes,1);
        iVar6 = pFVar3->kindex;
      }
      check_fixed_int(cards[(long)iVar6 + -1],out);
      goto LAB_0010fdfd;
    }
  }
  builtin_strncpy(errmes + 0x10,"GCOUNT keyword.",0x10);
  builtin_strncpy(errmes,"cannot find the ",0x10);
  wrterr(out,errmes,1);
LAB_0010fdfd:
  lVar10 = 0;
  do {
    strcpy(temp,(char *)((long)&DAT_001d0980 + (long)(int)(&DAT_001d0980)[lVar10]));
    ppcVar5 = tmpkwds;
    ptemp = temp;
    pvVar9 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstre);
    if (pvVar9 != (void *)0x0) {
      uVar14 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
      if ((int)uVar14 < 2) {
        uVar17 = uVar14 & 0xffffffff;
        iVar6 = 1;
      }
      else {
        iVar6 = 1;
        uVar17 = uVar14 & 0xffffffff;
        pvVar13 = pvVar9;
        do {
          pvVar13 = (void *)((long)pvVar13 + -8);
          iVar7 = compstre(&ptemp,pvVar13);
          if (iVar7 != 0) goto LAB_0010feb7;
          uVar16 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar16;
          iVar6 = iVar6 + 1;
        } while (uVar16 != 1);
        uVar17 = 1;
        iVar6 = (int)uVar14;
      }
LAB_0010feb7:
      iVar7 = (int)uVar17;
      if (iVar6 + iVar7 < iVar1) {
        iVar6 = iVar6 + iVar7;
        do {
          iVar6 = iVar6 + 1;
          pvVar9 = (void *)((long)pvVar9 + 8);
          iVar8 = compstre(&ptemp,pvVar9);
          if (iVar8 != 0) break;
        } while (iVar6 < iVar1);
      }
      if (-1 < iVar7) {
        sprintf(errmes,"Keyword #%d, %s is not allowed in extensions.",
                (ulong)(uint)hduptr->kwds[uVar17]->kindex);
        wrterr(out,errmes,1);
      }
    }
    lVar10 = lVar10 + 1;
  } while (lVar10 != 3);
  lVar10 = 0;
  do {
    strcpy(temp,(char *)((long)&DAT_001d098c + (long)(int)(&DAT_001d098c)[lVar10]));
    ppcVar5 = tmpkwds;
    ptemp = temp;
    pvVar9 = bsearch(&ptemp,tmpkwds,__nmemb,8,compstrp);
    if (pvVar9 != (void *)0x0) {
      uVar14 = (ulong)((long)pvVar9 - (long)ppcVar5) >> 3;
      if ((int)uVar14 < 2) {
        uVar17 = uVar14 & 0xffffffff;
        uVar14 = 1;
      }
      else {
        uVar16 = 1;
        uVar17 = uVar14 & 0xffffffff;
        pvVar13 = pvVar9;
        do {
          pvVar13 = (void *)((long)pvVar13 + -8);
          iVar6 = compstrp(&ptemp,pvVar13);
          if (iVar6 != 0) {
            uVar14 = (ulong)uVar16;
            goto LAB_0010fff6;
          }
          uVar15 = (int)uVar17 - 1;
          uVar17 = (ulong)uVar15;
          uVar16 = uVar16 + 1;
        } while (uVar15 != 1);
        uVar17 = 1;
      }
LAB_0010fff6:
      iVar6 = (int)uVar17;
      iVar7 = (int)uVar14;
      if ((int)uVar14 + iVar6 < iVar1) {
        do {
          iVar18 = (int)uVar14;
          pvVar9 = (void *)((long)pvVar9 + 8);
          iVar8 = compstrp(&ptemp,pvVar9);
          iVar7 = iVar18;
          if (iVar8 != 0) break;
          uVar14 = (ulong)(iVar18 + 1);
          iVar7 = iVar1 - iVar6;
        } while (iVar18 + iVar6 + 1 < iVar1);
      }
      if ((-1 < iVar6) && (0 < iVar7)) {
        ppuVar11 = __ctype_b_loc();
        do {
          if ((*(byte *)((long)*ppuVar11 + (long)ppFVar2[uVar17]->kname[5] * 2 + 1) & 8) != 0) {
            sprintf(errmes,"Keyword #%d, %s is only allowed in Random Groups structures.",
                    (ulong)(uint)hduptr->kwds[uVar17]->kindex);
            wrterr(out,errmes,1);
          }
          uVar17 = uVar17 + 1;
        } while ((int)uVar17 < iVar7 + iVar6);
      }
    }
    lVar10 = lVar10 + 1;
    if (lVar10 == 4) {
      return;
    }
  } while( true );
}

Assistant:

void test_ext(fitsfile *infits, 	/* input fits file   */ 
	     FILE*     out,	/* output ascii file */
	     FitsHdu  *hduptr	/* information about header */
            ) 
{
    FitsKey *pkey;
    FitsKey **kwds;
    int  i,j,k,n;
    int numusrkey;
    char *exlkey[] = {"SIMPLE","EXTEND", "BLOCKED", }; 
    int nexlkey = 3;
    char *exlnkey[] = {"PTYPE","PSCAL", "PZERO", "GROUPS", }; 
    int nexlnkey = 4;
    int hdunum;
    char *p;

    numusrkey = hduptr->tkeys;
    kwds = hduptr->kwds;
    hdunum = hduptr->hdunum;

    /* check the duplicate extensions */
    for (i = hdunum - 1; i > 0; i--) { 
        if(test_hduname(hdunum,i)) { 
            sprintf(comm, 
	    "The HDU %d and %d have identical type/name/version", 
                hdunum,i);
            wrtwrn(out,comm,0);
        }
    }

    /* check the position of the PCOUNT  */
    strcpy(temp,"PCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the PCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->pcount = (LONGLONG) atof(pkey->kvalue);
        if( pkey->kindex != 4 + hduptr->naxis ) {
	     sprintf(errmes,"PCOUNT is not in record %d of the header.",
                 hduptr->naxis + 4); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    /* check the position of the GCOUNT */
    strcpy(temp,"GCOUNT");
    ptemp = temp;
    key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n); 
    if( k < 0) { 
	sprintf(errmes,"cannot find the GCOUNT keyword.");
        wrterr(out,errmes,1);
    } 
    else {
        pkey = hduptr->kwds[k]; 
	if(check_int(pkey,out)) 
	    hduptr->gcount = (int) strtol(pkey->kvalue,NULL,10);
        if( pkey->kindex != 5 + hduptr->naxis ) {
	     sprintf(errmes,"GCOUNT is not in record %d of the header.",
                 hduptr->naxis + 5); 
             wrterr(out,errmes,1);
        } 

        check_fixed_int(cards[pkey->kindex - 1], out);
    }

    for (i = 0; i < nexlkey; i++) {
        strcpy(temp,exlkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,1,&k,&n);  
    	if(k > -1) {
            pkey = hduptr->kwds[k];
            sprintf( errmes, 
               "Keyword #%d, %s is not allowed in extensions.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
        } 
    }

    for (i = 0; i < nexlnkey; i++) {
        strcpy(temp,exlnkey[i]);
    	ptemp = temp;
    	key_match(tmpkwds,numusrkey,&ptemp,0,&k,&n);  
    	if(k > -1) {

          for (j = k; j< k + n ; j++){ 
	    p = kwds[j]->kname; 
	    p += 5;
            if(!isdigit((int)*p)) continue;

            pkey = hduptr->kwds[j];
            sprintf( errmes, 
               "Keyword #%d, %s is only allowed in Random Groups structures.",
               pkey->kindex,pkey->kname);
            wrterr(out,errmes,1);
          }
        } 
    }

    return;

}